

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256-ni.c
# Opt level: O1

void sha256_ni_digest(ssh_hash *hash,uint8_t *digest)

{
  undefined4 uVar1;
  BinarySink *pBVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  pBVar2 = hash[-3].binarysink_;
  uVar3 = 0x37U - *(int *)&hash[-3].vt & 0x3f;
  uVar4 = (ulong)uVar3;
  BinarySink_put_byte(hash[-1].binarysink_,0x80);
  if (uVar3 != 0) {
    do {
      BinarySink_put_byte(hash[-1].binarysink_,'\0');
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  BinarySink_put_uint64(hash[-1].binarysink_,(long)pBVar2 << 3);
  if (hash[-3].vt == (ssh_hashalg *)0x0) {
    auVar5._4_4_ = *(undefined4 *)&hash[-9].binarysink_;
    auVar5._0_4_ = *(undefined4 *)((long)&hash[-9].binarysink_ + 4);
    auVar5._8_4_ = *(undefined4 *)((long)&hash[-9].vt + 4);
    auVar5._12_4_ = *(undefined4 *)&hash[-9].vt;
    uVar1 = *(undefined4 *)((long)&hash[-8].vt + 4);
    auVar6._4_4_ = *(undefined4 *)&hash[-8].vt;
    auVar6._0_4_ = uVar1;
    auVar6._8_4_ = uVar1;
    auVar6._12_4_ = *(undefined4 *)&hash[-8].binarysink_;
    auVar7 = pshufb(auVar6,ZEXT816(0xc0d0e0f08090a0b));
    auVar8 = pshufb(auVar5,ZEXT816(0x405060700010203));
    auVar6 = pshufb(auVar6,ZEXT816(0x405060700010203));
    auVar5 = pshufb(auVar5,ZEXT816(0xc0d0e0f08090a0b));
    *(long *)digest = auVar8._0_8_;
    *(long *)(digest + 8) = auVar7._0_8_;
    *(long *)(digest + 0x10) = auVar5._0_8_;
    *(long *)(digest + 0x18) = auVar6._0_8_;
    return;
  }
  __assert_fail("blk->used == 0 && \"Should have exactly hit a block boundary\"",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha256.h",
                0x68,"void sha256_block_pad(sha256_block *, BinarySink *)");
}

Assistant:

static void sha256_ni_digest(ssh_hash *hash, uint8_t *digest)
{
    sha256_ni *s = container_of(hash, sha256_ni, hash);

    sha256_block_pad(&s->blk, BinarySink_UPCAST(s));

    /* Rearrange the words into the output order */
    __m128i feba = _mm_shuffle_epi32(s->core[0], 0x1B);
    __m128i dchg = _mm_shuffle_epi32(s->core[1], 0xB1);
    __m128i dcba = _mm_blend_epi16(feba, dchg, 0xF0);
    __m128i hgfe = _mm_alignr_epi8(dchg, feba, 8);

    /* Byte-swap them into the output endianness */
    const __m128i mask = _mm_setr_epi8(3,2,1,0,7,6,5,4,11,10,9,8,15,14,13,12);
    dcba = _mm_shuffle_epi8(dcba, mask);
    hgfe = _mm_shuffle_epi8(hgfe, mask);

    /* And store them */
    __m128i *output = (__m128i *)digest;
    _mm_storeu_si128(output, dcba);
    _mm_storeu_si128(output+1, hgfe);
}